

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O3

void __thiscall
GenericSection_RoundTripForPopulated_Test::TestBody(GenericSection_RoundTripForPopulated_Test *this)

{
  uchar *puVar1;
  database *export_db;
  undefined8 uVar2;
  uint generation;
  mapped_type *pmVar3;
  string *src;
  parser<pstore::exchange::import_ns::callbacks> *ppVar4;
  char *pcVar5;
  database *pdVar6;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  section_content *args_2;
  int iVar7;
  pointer *__ptr;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out;
  section_kind kind;
  mock_mutex mutex;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  string exported_json;
  section_content imported_content;
  array<const_char_*,_2UL> names;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  string_mapping exported_names;
  ostringstream exported_names_stream;
  string_mapping imported_names;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff97c;
  AssertHelper local_680;
  database *local_678;
  section_kind local_669;
  undefined1 local_668 [8];
  undefined1 local_660 [8];
  undefined1 local_658 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_650;
  _List_node_base *local_648;
  AssertHelper local_638;
  undefined1 local_630 [16];
  pointer local_620 [15];
  pointer local_5a8;
  pointer local_598;
  database *local_588;
  undefined1 local_580 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570 [7];
  pointer local_4f8;
  pointer local_4e8;
  vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> local_4d8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  undefined1 local_498 [8];
  undefined1 local_490 [96];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_430;
  _Alloc_hider local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  coord local_400;
  small_vector<unsigned_char,_128UL> *local_3f8;
  vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> local_3f0;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> vStack_3d8;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [4];
  int local_368;
  error_category *local_360;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  _Alloc_hider local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  char *local_318;
  char *pcStack_310;
  char *local_308;
  not_null<pstore::database_*> local_300;
  undefined1 local_2f8 [144];
  pointer local_268;
  pointer local_258;
  uchar *local_250;
  pointer local_248;
  pointer piStack_240;
  pointer local_238;
  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> vStack_230;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_218;
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e0;
  ostringstream local_1a8;
  undefined1 local_158 [56];
  _List_node_base *local_120;
  pointer local_118;
  element_type *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  __node_base local_100;
  size_type sStack_f8;
  float local_f0;
  size_t local_e8;
  mutex_type *pmStack_e0;
  small_vector<unsigned_char,_128UL> local_d8;
  
  local_669 = text;
  local_318 = "name1";
  pcStack_310 = "name2";
  local_218._M_buckets = &local_218._M_single_bucket;
  local_218._M_bucket_count = 1;
  local_218._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_218._M_element_count = 0;
  local_218._M_rehash_policy._M_max_load_factor = 1.0;
  local_218._M_rehash_policy._M_next_resize = 0;
  local_218._M_single_bucket = (__node_base_ptr)0x0;
  pdVar6 = &(this->super_GenericSection).export_db_;
  out.iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
             )0x0;
  out.container =
       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
        *)&local_218;
  add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (pdVar6,&local_318,&local_308,out);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)&local_1e0,pdVar6);
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_1a8.super_ostream_base,0x1000);
  local_1a8.str_._M_dataplus._M_p = (pointer)&local_1a8.str_.field_2;
  local_1a8.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_0023b498;
  local_1a8.str_._M_string_length = 0;
  local_1a8.str_.field_2._M_local_buf[0] = '\0';
  generation = pstore::database::get_current_revision(pdVar6);
  puVar1 = local_2f8 + 0x10;
  pcVar5 = "";
  local_2f8._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"","");
  uVar8 = 0;
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)3>
            (&local_1a8.super_ostream_base,(indent)0x0,pdVar6,generation,(string *)local_2f8,
             (string_mapping *)&local_1e0,false);
  local_588 = pdVar6;
  if ((uchar *)local_2f8._0_8_ != puVar1) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  iVar7 = 0;
  memset((small_vector<unsigned_char,_128UL> *)(local_2f8 + 8),0,0xa0);
  local_248 = (pointer)0x0;
  piStack_240 = (pointer)0x0;
  local_238 = (pointer)0x0;
  vStack_230.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_230.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_230.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8[1] = ' ';
  local_4a0 = (undefined1  [8])(local_2f8 + 8);
  local_250 = puVar1;
  do {
    local_630[0] = (char)iVar7;
    std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>::operator=
              ((back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> *)local_4a0,
               local_630);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 5);
  local_3c0[0] = data;
  local_580[0] = 3;
  local_4a0 = (undefined1  [8])&DAT_00000005;
  local_630._0_8_ = (_func_int **)0x7;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             &local_248,local_3c0,local_580,(unsigned_long *)local_4a0,(long *)local_630);
  local_3c0[0] = 0xb;
  local_580[0] = 0xb;
  local_4a0 = (undefined1  [8])0xd;
  local_630._0_8_ = (_func_int **)0x11;
  std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>::
  emplace_back<pstore::repo::section_kind,unsigned_char,unsigned_long,long>
            ((vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>> *)
             &local_248,local_3c0,local_580,(unsigned_long *)local_4a0,(long *)local_630);
  pdVar6 = local_588;
  local_4a0 = (undefined1  [8])local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"name1","");
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_218,(key_type *)local_4a0);
  local_158[0] = 0x13;
  local_580._0_8_ = local_580._0_8_ & 0xffffffff00000000;
  local_630._0_8_ = (_func_int **)0x17;
  local_3c0._0_8_ = (element_type *)0x1d;
  std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>::
  emplace_back<pstore::typed_address<pstore::indirect_string>&,unsigned_char,pstore::repo::binding,unsigned_long,long>
            ((vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>> *)
             &vStack_230,pmVar3,local_158,(binding *)local_580,(unsigned_long *)local_630,
             (long *)local_3c0);
  if (local_4a0 != (undefined1  [8])local_490) {
    operator_delete((void *)local_4a0,local_490._0_8_ + 1);
  }
  local_4a0 = (undefined1  [8])local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"name2","");
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_218,(key_type *)local_4a0);
  local_158[0] = 0x1f;
  local_580._0_4_ = 1;
  local_630._0_8_ = (_func_int **)0x25;
  args_2 = (section_content *)local_3c0;
  local_3c0._0_8_ = (element_type *)0x29;
  std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>::
  emplace_back<pstore::typed_address<pstore::indirect_string>&,unsigned_char,pstore::repo::binding,unsigned_long,long>
            ((vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>> *)
             &vStack_230,pmVar3,local_158,(binding *)local_580,(unsigned_long *)local_630,
             (long *)args_2);
  if (local_4a0 != (undefined1  [8])local_490) {
    operator_delete((void *)local_4a0,local_490._0_8_ + 1);
  }
  export_section<(pstore::repo::section_kind)0>
            ((string *)local_4c0,pdVar6,(string_mapping *)&local_1e0,(section_content *)local_2f8,
             false);
  local_158._24_8_ = (long)local_158 + 0x18;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ =
       (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )0x0;
  local_158._16_8_ = (pointer)0x0;
  local_158._40_8_ =
       (__uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>)0x0;
  local_158._48_8_ = local_158 + 0x30;
  local_118 = (pointer)0x0;
  local_110 = (element_type *)&pmStack_e0;
  local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_100._M_nxt = (_Hash_node_base *)0x0;
  sStack_f8 = 0;
  local_f0 = 1.0;
  local_e8 = 0;
  pmStack_e0 = (mutex_type *)0x0;
  local_4a0 = (undefined1  [8])local_668;
  local_498[0] = false;
  local_158._32_8_ = local_158._24_8_;
  local_120 = (_List_node_base *)local_158._48_8_;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_4a0);
  pdVar6 = &(this->super_GenericSection).import_db_;
  local_498[0] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_630,pdVar6,(lock_type *)local_4a0);
  local_300.ptr_ = pdVar6;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_300);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>
            ((callbacks *)local_580,local_300,
             (transaction<std::unique_lock<mock_mutex>_> *)local_630,(string_mapping *)local_158);
  local_3c0._0_8_ = local_580._0_8_;
  local_3c0._8_8_ = local_580._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_580._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_580._8_8_ + 8) = *(_Atomic_word *)(local_580._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_580._8_8_ + 8) = *(_Atomic_word *)(local_580._8_8_ + 8) + 1;
    }
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_4a0,(callbacks *)local_3c0,none
            );
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_580._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_580._8_8_);
  }
  src = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_1a8);
  ppVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)local_4a0,src);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar4);
  local_658[0] = local_490._72_4_ == 0;
  pbStack_650 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_490._72_4_ != 0) {
    testing::Message::Message((Message *)&local_680);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_680.data_._4_4_,local_680.data_._0_4_) + 0x10),
               "Expected the JSON parse to succeed (",0x24);
    (**(code **)(*(long *)local_490._80_8_ + 0x20))(local_3c0,local_490._80_8_,local_490._72_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_680.data_._4_4_,local_680.data_._0_4_) + 0x10),
               (char *)local_3c0._0_8_,local_3c0._8_8_);
    local_580[0] = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_680.data_._4_4_,local_680.data_._0_4_) + 0x10),local_580,1
              );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_580,(internal *)local_658,(AssertionResult *)0x1d9922,"true","false",
               (char *)args_2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0xb2,(char *)local_580._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)&local_680);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._0_8_ != local_570) {
      operator_delete((void *)local_580._0_8_,local_570[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._0_8_ != local_3b0) {
      operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_680.data_._4_4_,local_680.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_680.data_._4_4_,local_680.data_._0_4_) + 8))();
    }
    if (pbStack_650 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_650,pbStack_650);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_p != &local_410) {
      operator_delete(local_420._M_p,local_410._M_allocated_capacity + 1);
    }
    if (local_430._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_430._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)local_498);
    if (local_4a0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_4a0,0x68);
    }
    local_630._0_8_ = &PTR__transaction_00234578;
    pstore::transaction_base::rollback((transaction_base *)local_630);
    goto LAB_00168f0d;
  }
  pstore::transaction_base::commit((transaction_base *)local_630);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_p != &local_410) {
    operator_delete(local_420._M_p,local_410._M_allocated_capacity + 1);
  }
  if (local_430._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_430._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)local_498);
  if (local_4a0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4a0,0x68);
  }
  local_630._0_8_ = &PTR__transaction_00234578;
  pstore::transaction_base::rollback((transaction_base *)local_630);
  local_660 = (undefined1  [8])local_658;
  local_658 = (undefined1  [8])0x0;
  pbStack_650 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_648 = (_List_node_base *)0x0;
  local_4a0._0_2_ = 0x100;
  memset((small_vector<unsigned_char,_128UL> *)local_498,0,0xa0);
  local_3f0.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f0.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f0.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_3d8.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_3d8.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_3d8.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f8 = (small_vector<unsigned_char,_128UL> *)local_490;
  (anonymous_namespace)::
  make_json_object_parser<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
            ((parser<pstore::exchange::import_ns::callbacks> *)local_3c0,
             (_anonymous_namespace_ *)pdVar6,(database *)local_158,(section_kind)local_4a0,
             (string_mapping *)local_660,args_2,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff97c,uVar8));
  uVar2 = local_4c0._0_8_;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_630,local_4c0._8_8_)
  ;
  local_630._8_8_ = uVar2;
  ppVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::
           input<pstore::gsl::span<char_const,_1l>>
                     ((parser<pstore::exchange::import_ns::callbacks> *)local_3c0,
                      (span<const_char,__1L> *)local_630);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar4);
  local_680.data_._0_4_ = CONCAT31(local_680.data_._1_3_,local_368 == 0);
  local_678 = (database *)0x0;
  if (local_368 == 0) {
    local_580._0_8_ = (long)pbStack_650 - (long)local_658 >> 3;
    local_680.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_630,"dispatchers.size ()","1U",(unsigned_long *)local_580,
               (uint *)&local_680);
    export_db = local_588;
    if (local_630[0] == '\0') {
      testing::Message::Message((Message *)local_580);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_580._0_8_ + 0x10),
                 "Expected a single creation dispatcher to be added to the dispatchers container",
                 0x4e);
      if ((database *)local_630._8_8_ != (database *)0x0) {
        pcVar5 = *(char **)local_630._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_680,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                 ,199,pcVar5);
      testing::internal::AssertHelper::operator=(&local_680,(Message *)local_580);
      testing::internal::AssertHelper::~AssertHelper(&local_680);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_580._0_8_ + 8))();
      }
      if ((database *)local_630._8_8_ != (database *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_630 + 8);
        pdVar6 = (database *)local_630._8_8_;
        goto LAB_001689b2;
      }
    }
    else {
      if ((database *)local_630._8_8_ != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_630 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_630._8_8_);
      }
      testing::internal::CmpHelperEQ<pstore::repo::section_kind,pstore::repo::section_kind>
                ((internal *)local_630,"dispatchers.front ()->kind ()","kind",
                 (section_kind *)&(*(sstring_view<const_char_*> **)local_658)->size_,&local_669);
      if (local_630[0] == '\0') {
        testing::Message::Message((Message *)local_580);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_580._0_8_ + 0x10),
                   "The creation dispatcher should be able to create a text section",0x3f);
        if ((database *)local_630._8_8_ == (database *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_630._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_680,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0xc9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_680,(Message *)local_580);
        testing::internal::AssertHelper::~AssertHelper(&local_680);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_580._0_8_ + 8))();
        }
      }
      if ((database *)local_630._8_8_ != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_630 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_630._8_8_);
      }
      testing::internal::CmpHelperEQ<pstore::repo::section_kind,pstore::repo::section_kind>
                ((internal *)local_630,"exported_content.kind","imported_content.kind",local_2f8,
                 local_4a0);
      if (local_630[0] == '\0') {
        testing::Message::Message((Message *)local_580);
        if ((database *)local_630._8_8_ == (database *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_630._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_680,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0xcc,pcVar5);
        testing::internal::AssertHelper::operator=(&local_680,(Message *)local_580);
        testing::internal::AssertHelper::~AssertHelper(&local_680);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_580._0_8_ + 8))();
        }
      }
      if ((database *)local_630._8_8_ != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_630 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_630._8_8_);
      }
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                ((internal *)local_630,"exported_content.align","imported_content.align",
                 local_2f8 + 1,local_4a0 + 1);
      if (local_630[0] == '\0') {
        testing::Message::Message((Message *)local_580);
        if ((database *)local_630._8_8_ == (database *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_630._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_680,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0xcd,pcVar5);
        testing::internal::AssertHelper::operator=(&local_680,(Message *)local_580);
        testing::internal::AssertHelper::~AssertHelper(&local_680);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_580._0_8_ + 8))();
        }
      }
      if ((database *)local_630._8_8_ != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_630 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_630._8_8_);
      }
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                ((small_vector<unsigned_char,_128UL> *)local_630,
                 (small_vector<unsigned_char,_128UL> *)local_498);
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                (&local_d8,(small_vector<unsigned_char,_128UL> *)local_630);
      if (local_5a8 != (pointer)0x0) {
        operator_delete(local_5a8,(long)local_598 - (long)local_5a8);
      }
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                ((small_vector<unsigned_char,_128UL> *)local_630,&local_d8);
      pstore::small_vector<unsigned_char,_128UL>::small_vector
                ((small_vector<unsigned_char,_128UL> *)local_580,
                 (small_vector<unsigned_char,_128UL> *)local_630);
      if (local_5a8 != (pointer)0x0) {
        operator_delete(local_5a8,(long)local_598 - (long)local_5a8);
      }
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>>>
      ::operator()(&local_680,local_580,
                   (small_vector<unsigned_char,_128UL> *)"exported_content.data");
      if (local_4f8 != (pointer)0x0) {
        operator_delete(local_4f8,(long)local_4e8 - (long)local_4f8);
      }
      if (local_d8.big_buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.big_buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.big_buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.big_buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_680.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_630);
        if (local_678 == (database *)0x0) {
          message = "";
        }
        else {
          message = ((_Alloc_hider *)&local_678->_vptr_database)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_580,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0xce,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_580,(Message *)local_630);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_580);
        if ((pointer *)local_630._0_8_ != (pointer *)0x0) {
          (*(code *)(*(pointer *)local_630._0_8_)->offset)();
        }
      }
      if (local_678 != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_678,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678)
        ;
      }
      std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::
      vector((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_630,&local_3f0);
      std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::
      vector(&local_4d8,
             (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_630);
      if ((pointer *)local_630._0_8_ != (pointer *)0x0) {
        operator_delete((void *)local_630._0_8_,(long)local_620[0] - local_630._0_8_);
      }
      std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::
      vector((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_630,&local_4d8);
      std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::
      vector((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_580,
             (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             local_630);
      if ((pointer *)local_630._0_8_ != (pointer *)0x0) {
        operator_delete((void *)local_630._0_8_,(long)local_620[0] - local_630._0_8_);
      }
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>>
      ::operator()(&local_680,local_580,
                   (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    *)"exported_content.ifixups");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_580._0_8_,local_570[0]._M_allocated_capacity - local_580._0_8_
                       );
      }
      if (local_4d8.
          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d8.
                        super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_4d8.
                              super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4d8.
                              super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_680.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_630);
        if (local_678 == (database *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((_Alloc_hider *)&local_678->_vptr_database)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_580,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
                   ,0xcf,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_580,(Message *)local_630);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_580);
        if ((pointer *)local_630._0_8_ != (pointer *)0x0) {
          (*(code *)(*(pointer *)local_630._0_8_)->offset)();
        }
      }
      if (local_678 != (database *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_678,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678)
        ;
      }
      compare_external_fixups<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
                (export_db,&vStack_230,pdVar6,&vStack_3d8);
    }
  }
  else {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_678;
    testing::Message::Message((Message *)local_668);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_668 + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_360 + 0x20))(local_630,local_360,local_368);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_668 + 0x10),(char *)local_630._0_8_,local_630._8_8_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_580,(internal *)&local_680,(AssertionResult *)0x1d9922,"true","false"
               ,(char *)args_2);
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0xc5,(char *)local_580._0_8_);
    testing::internal::AssertHelper::operator=(&local_638,(Message *)local_668);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._0_8_ != local_570) {
      operator_delete((void *)local_580._0_8_,local_570[0]._M_allocated_capacity + 1);
    }
    if ((pointer *)local_630._0_8_ != local_620) {
      operator_delete((void *)local_630._0_8_,(ulong)&local_620[0]->type);
    }
    if (local_668 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_668 + 8))();
    }
    pdVar6 = local_678;
    if (local_678 != (database *)0x0) {
LAB_001689b2:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pdVar6);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_p != &local_330) {
    operator_delete(local_340._M_p,(ulong)(local_330._M_allocated_capacity + 1));
  }
  if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)(local_3c0 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_3c0._0_8_,0x68);
  }
  if (vStack_3d8.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_3d8.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_3d8.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_3d8.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f0.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f0.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f0.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f0.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_410._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_410._M_allocated_capacity,(long)local_400 - local_410._0_8_);
  }
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
             *)local_658);
LAB_00168f0d:
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_158);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_4c0 + 0x10)) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  if (vStack_230.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_230.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_230.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_230.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_248 != (pointer)0x0) {
    operator_delete(local_248,(long)local_238 - (long)local_248);
  }
  if (local_268 != (pointer)0x0) {
    operator_delete(local_268,(long)local_258 - (long)local_268);
  }
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_1a8);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1e0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_218);
  return;
}

Assistant:

TEST_F (GenericSection, RoundTripForPopulated) {
    using namespace pstore::exchange;

    constexpr auto kind = pstore::repo::section_kind::text;
    constexpr auto names_index = pstore::trailer::indices::name;
    constexpr auto comments = false;

    // The type used to store a text section's properties.
    using section_type = pstore::repo::enum_to_section_t<kind>;
    static_assert (std::is_same<section_type, pstore::repo::generic_section>::value,
                   "Expected text to map to generic_section");

    // Add names to the store so that external fixups can use then. add_export_strings()
    // yields a mapping from each name to its indirect-address.
    constexpr auto * name1 = "name1";
    constexpr auto * name2 = "name2";
    std::array<pstore::gsl::czstring, 2> names{{name1, name2}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<names_index> (export_db_, std::begin (names), std::end (names),
                                     std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<names_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                          export_db_.get_current_revision (), "", &exported_names,
                                          comments);


    pstore::repo::section_content exported_content;
    exported_content.align = 32U;
    {
        unsigned value = 0;
        std::generate_n (std::back_inserter (exported_content.data), 5U, [&value] () {
            return static_cast<decltype (exported_content.data)::value_type> (value++);
        });
    }
    exported_content.ifixups.emplace_back (pstore::repo::section_kind::data,
                                           pstore::repo::relocation_type{3},
                                           std::uint64_t{5} /*offset*/, std::int64_t{7} /*addend*/);
    exported_content.ifixups.emplace_back (
        pstore::repo::section_kind::read_only, pstore::repo::relocation_type{11},
        std::uint64_t{13} /*offset*/, std::int64_t{17} /*addend*/);
    exported_content.xfixups.emplace_back (
        indir_strings[name1], pstore::repo::relocation_type{19}, pstore::repo::binding::strong,
        std::uint64_t{23} /*offset*/, std::int64_t{29} /*addend*/);
    exported_content.xfixups.emplace_back (
        indir_strings[name2], pstore::repo::relocation_type{31}, pstore::repo::binding::weak,
        std::uint64_t{37} /*offset*/, std::int64_t{41} /*addend*/);


    std::string const exported_json =
        export_section<kind> (export_db_, exported_names, exported_content, comments);



    // Parse the exported names JSON. The resulting index-to-string mappings are then available via
    // imported_names.
    import_ns::string_mapping imported_names;
    {
        // Create matching names in the imported database.
        mock_mutex mutex;
        using transaction_lock = std::unique_lock<mock_mutex>;
        auto transaction = begin (import_db_, transaction_lock{mutex});

        auto parser = pstore::json::make_parser (
            import_ns::callbacks::make<
                import_ns::array_rule<import_ns::strings_array_members, decltype (&transaction),
                                      decltype (&imported_names)>> (&import_db_, &transaction,
                                                                    &imported_names));
        parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (parser.has_error ())
            << "Expected the JSON parse to succeed (" << parser.last_error ().message () << ')';

        transaction.commit ();
    }

    // Now set up the import. We'll build two objects: an instance of a section-creation-dispatcher
    // which knows how to build a text section and a section-content which will describe the
    // contents of that new section.
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);

    pstore::repo::section_content imported_content;

    // Find the rule that is used to import sections represented by an instance of section_type.
    using section_importer = import_ns::section_to_importer_t<section_type, decltype (inserter)>;
    auto parser = make_json_object_parser<section_importer> (&import_db_, kind, &imported_names,
                                                             &imported_content, &inserter);
    parser.input (exported_json).eof ();
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();

    ASSERT_EQ (dispatchers.size (), 1U)
        << "Expected a single creation dispatcher to be added to the dispatchers container";
    EXPECT_EQ (dispatchers.front ()->kind (), kind)
        << "The creation dispatcher should be able to create a text section";

    EXPECT_EQ (exported_content.kind, imported_content.kind);
    EXPECT_EQ (exported_content.align, imported_content.align);
    EXPECT_THAT (exported_content.data, testing::ContainerEq (imported_content.data));
    EXPECT_THAT (exported_content.ifixups, testing::ContainerEq (imported_content.ifixups));
    compare_external_fixups (export_db_, exported_content.xfixups, import_db_,
                             imported_content.xfixups);
}